

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t * Acb_NtkFindNodes(Acb_Ntk_t *p,Vec_Int_t *vRoots,Vec_Int_t *vDivs)

{
  int iVar1;
  Vec_Int_t *vNodes;
  int *piVar2;
  int iVar3;
  
  vNodes = Vec_IntAlloc(1000);
  Acb_NtkIncTravId(p);
  for (iVar3 = 0; iVar3 < vRoots->nSize; iVar3 = iVar3 + 1) {
    iVar1 = Vec_IntEntry(vRoots,iVar3);
    iVar1 = Vec_IntEntry(&p->vCos,iVar1);
    piVar2 = Acb_ObjFanins(p,iVar1);
    Acb_NtkFindNodes_rec(p,piVar2[1],vNodes);
  }
  if (vDivs != (Vec_Int_t *)0x0) {
    for (iVar3 = 0; iVar3 < vDivs->nSize; iVar3 = iVar3 + 1) {
      iVar1 = Vec_IntEntry(vDivs,iVar3);
      Acb_NtkFindNodes_rec(p,iVar1,vNodes);
    }
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Acb_NtkFindNodes( Acb_Ntk_t * p, Vec_Int_t * vRoots, Vec_Int_t * vDivs )
{
    int i, iObj;
    Vec_Int_t * vNodes = Vec_IntAlloc( 1000 );
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCoDriverVec( vRoots, p, iObj, i )
        Acb_NtkFindNodes_rec( p, iObj, vNodes );
    if ( vDivs )
        Vec_IntForEachEntry( vDivs, iObj, i )
            Acb_NtkFindNodes_rec( p, iObj, vNodes );
    return vNodes;
}